

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlWriter::writeEncodedText(XmlWriter *this,string *text)

{
  char cVar1;
  ostream *poVar2;
  char *pcVar3;
  string *in_RSI;
  XmlWriter *in_RDI;
  size_type pos;
  string mtext;
  string local_88 [48];
  string local_58 [32];
  long local_38;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  local_38 = std::__cxx11::string::find_first_of
                       ((char *)local_30,(ulong)writeEncodedText::charsToEncode);
  while (local_38 != -1) {
    poVar2 = stream(in_RDI);
    std::__cxx11::string::substr((ulong)local_58,(ulong)local_30);
    std::operator<<(poVar2,local_58);
    std::__cxx11::string::~string(local_58);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
    cVar1 = *pcVar3;
    if (cVar1 == '\"') {
      poVar2 = stream(in_RDI);
      std::operator<<(poVar2,"&quot;");
    }
    else if (cVar1 == '&') {
      poVar2 = stream(in_RDI);
      std::operator<<(poVar2,"&amp;");
    }
    else if (cVar1 == '<') {
      poVar2 = stream(in_RDI);
      std::operator<<(poVar2,"&lt;");
    }
    std::__cxx11::string::substr((ulong)local_88,(ulong)local_30);
    std::__cxx11::string::operator=(local_30,local_88);
    std::__cxx11::string::~string(local_88);
    local_38 = std::__cxx11::string::find_first_of
                         ((char *)local_30,(ulong)writeEncodedText::charsToEncode);
  }
  poVar2 = stream(in_RDI);
  std::operator<<(poVar2,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void writeEncodedText( std::string const& text ) {
            static const char* charsToEncode = "<&\"";
            std::string mtext = text;
            std::string::size_type pos = mtext.find_first_of( charsToEncode );
            while( pos != std::string::npos ) {
                stream() << mtext.substr( 0, pos );

                switch( mtext[pos] ) {
                    case '<':
                        stream() << "&lt;";
                        break;
                    case '&':
                        stream() << "&amp;";
                        break;
                    case '\"':
                        stream() << "&quot;";
                        break;
                }
                mtext = mtext.substr( pos+1 );
                pos = mtext.find_first_of( charsToEncode );
            }
            stream() << mtext;
        }